

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::Status::ToStringSlow_abi_cxx11_
          (string *__return_storage_ptr__,Status *this,uintptr_t rep,StatusToStringMode mode)

{
  StatusCode SVar1;
  Nonnull<const_status_internal::StatusRep_*> this_00;
  StatusCode code;
  string local_98;
  string_view local_78;
  AlphaNum local_48;
  
  if (((ulong)this & 1) == 0) {
    this_00 = RepToPointer((uintptr_t)this);
    status_internal::StatusRep::ToString_abi_cxx11_
              (__return_storage_ptr__,this_00,(StatusToStringMode)rep);
  }
  else {
    SVar1 = InlinedRepToCode((uintptr_t)this);
    StatusCodeToString_abi_cxx11_(&local_98,(lts_20240722 *)(ulong)SVar1,code);
    local_48.piece_._M_len = local_98._M_string_length;
    local_48.piece_._M_str = local_98._M_dataplus._M_p;
    local_78 = NullSafeStringView(": ");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToStringSlow(uintptr_t rep, StatusToStringMode mode) {
  if (IsInlined(rep)) {
    return absl::StrCat(absl::StatusCodeToString(InlinedRepToCode(rep)), ": ");
  }
  return RepToPointer(rep)->ToString(mode);
}